

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O2

void __thiscall
qpdf::Stream::replaceFilterData
          (Stream *this,QPDFObjectHandle *filter,QPDFObjectHandle *decode_parms,size_t length)

{
  Members *pMVar1;
  allocator<char> local_59;
  _Alloc_hider in_stack_ffffffffffffffa8;
  QPDFObjectHandle local_38;
  size_t local_28;
  
  local_28 = length;
  pMVar1 = stream(this);
  if ((filter->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr != (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffffa8,"/Filter",(allocator<char> *)&local_38);
    QPDFObjectHandle::replaceKey(&pMVar1->stream_dict,(string *)&stack0xffffffffffffffa8,filter);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  }
  if ((decode_parms->super_BaseHandle).obj.
      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffffa8,"/DecodeParms",(allocator<char> *)&local_38);
    QPDFObjectHandle::replaceKey
              (&pMVar1->stream_dict,(string *)&stack0xffffffffffffffa8,decode_parms);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  }
  if (length == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffffa8,"/Length",(allocator<char> *)&local_38);
    QPDFObjectHandle::removeKey(&pMVar1->stream_dict,(string *)&stack0xffffffffffffffa8);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xffffffffffffffa8,"/Length",&local_59);
    QIntC::IntConverter<unsigned_long,_long_long,_false,_true>::convert(&local_28);
    QPDFObjectHandle::newInteger((longlong)in_stack_ffffffffffffffa8._M_p);
    QPDFObjectHandle::replaceKey(&pMVar1->stream_dict,(string *)&stack0xffffffffffffffa8,&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_38.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa8);
  return;
}

Assistant:

void
Stream::replaceFilterData(
    QPDFObjectHandle const& filter, QPDFObjectHandle const& decode_parms, size_t length)
{
    auto s = stream();
    if (filter) {
        s->stream_dict.replaceKey("/Filter", filter);
    }
    if (decode_parms) {
        s->stream_dict.replaceKey("/DecodeParms", decode_parms);
    }
    if (length == 0) {
        QTC::TC("qpdf", "QPDF_Stream unknown stream length");
        s->stream_dict.removeKey("/Length");
    } else {
        s->stream_dict.replaceKey(
            "/Length", QPDFObjectHandle::newInteger(QIntC::to_longlong(length)));
    }
}